

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O2

uint32_t __thiscall mjs::gc_heap::gc_move(gc_heap *this,uint32_t pos)

{
  allocation_context *this_00;
  uint uVar1;
  gc_heap_ptr_untyped **ppgVar2;
  slot *psVar3;
  uint uVar4;
  uint32_t uVar5;
  slot *psVar6;
  gc_type_info *pgVar7;
  slot *psVar8;
  char *__function;
  slot *psVar9;
  uint uVar10;
  ulong uVar11;
  char *__assertion;
  bool bVar12;
  allocation_result aVar13;
  
  uVar4 = (this->gc_state_).level + 1;
  (this->gc_state_).level = uVar4;
  if (uVar4 < 4) {
    uVar4 = pos - 1;
    if ((uVar4 < (this->alloc_context_).start_) || ((this->alloc_context_).next_free_ <= uVar4)) {
      __assertion = "alloc_context_.pos_inside(pos-1)";
      __function = "uint32_t mjs::gc_heap::gc_move(const uint32_t)";
      uVar4 = 0x5b;
    }
    else {
      this_00 = &this->alloc_context_;
      psVar6 = allocation_context::get_at(this_00,uVar4);
      uVar10 = (psVar6->allocation).type;
      if (uVar10 == 0xffffffff) {
        __assertion = "a.type != uninitialized_type_index";
        __function = "uint32_t mjs::gc_heap::gc_move(const uint32_t)";
        uVar4 = 0x5e;
      }
      else {
        uVar1 = psVar6->new_position;
        if ((uVar1 < 2) || ((this->alloc_context_).next_free_ - uVar4 < uVar1)) {
          __assertion = "a.size > 1 && a.size <= alloc_context_.next_free() - (pos - 1)";
          __function = "uint32_t mjs::gc_heap::gc_move(const uint32_t)";
          uVar4 = 0x5f;
        }
        else {
          if (uVar10 == 0xfffffffe) {
            psVar6 = allocation_context::get_at(this_00,pos);
            uVar5 = psVar6->new_position;
LAB_00134d26:
            (this->gc_state_).level = (this->gc_state_).level - 1;
            return uVar5;
          }
          if (uVar10 < gc_type_info::num_types_) {
            aVar13 = allocation_context::allocate
                               ((this->gc_state_).new_context,(ulong)(uVar1 * 8 - 8));
            psVar9 = aVar13.obj;
            uVar5 = aVar13.pos;
            if ((*(int *)((long)psVar9 + -4) == -1) &&
               (psVar9[-1].new_position == psVar6->new_position)) {
              uVar4 = (this->pointers_).size_;
              pgVar7 = slot_allocation_header::type_info(&psVar6->allocation);
              psVar8 = allocation_context::get_at(this_00,pos);
              (*pgVar7->move_)(psVar9,psVar8);
              *(uint32_t *)((long)psVar9 + -4) = (psVar6->allocation).type;
              uVar10 = (this->pointers_).size_ - uVar4;
              uVar11 = (ulong)uVar10;
              if (uVar10 != 0) {
                ppgVar2 = (this->pointers_).set_;
                uVar10 = uVar4;
                while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
                  psVar3 = (slot *)ppgVar2[uVar10];
                  if ((psVar3 < psVar9) || (psVar9 + ((ulong)psVar6->new_position - 1) <= psVar3)) {
                    __assertion = 
                    "reinterpret_cast<uintptr_t>(ps[num_pointers_initially+i]) >= reinterpret_cast<uintptr_t>(new_obj.obj) && reinterpret_cast<uintptr_t>(ps[num_pointers_initially+i]) < reinterpret_cast<uintptr_t>(new_obj.obj + a.size - 1)"
                    ;
                    __function = "uint32_t mjs::gc_heap::gc_move(const uint32_t)";
                    uVar4 = 0x7b;
                    goto LAB_00134d91;
                  }
                  register_fixup(this,&psVar3[1].new_position);
                  uVar10 = uVar10 + 1;
                }
              }
              if (pgVar7->destroy_ != (destroy_function)0x0) {
                (*pgVar7->destroy_)(psVar8);
              }
              if ((this->pointers_).size_ != uVar4) {
                __assert_fail("pointers_.size() == num_pointers_initially",
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp"
                              ,0x84,"uint32_t mjs::gc_heap::gc_move(const uint32_t)");
              }
              (psVar6->allocation).type = 0xfffffffe;
              psVar6 = allocation_context::get_at(this_00,pos);
              psVar6->new_position = uVar5;
              if (pgVar7->fixup_ != (fixup_function)0x0) {
                (*pgVar7->fixup_)(psVar9);
              }
              goto LAB_00134d26;
            }
            __assertion = 
            "new_obj.hdr().type == uninitialized_type_index && new_obj.hdr().size == a.size";
            __function = "uint32_t mjs::gc_heap::gc_move(const uint32_t)";
            uVar4 = 0x69;
          }
          else {
            __assertion = "a.type < gc_type_info::num_types()";
            __function = "uint32_t mjs::gc_heap::gc_move(const uint32_t)";
            uVar4 = 0x65;
          }
        }
      }
    }
  }
  else {
    __assertion = "l < 4 && \"Arbitrary recursion level reached\"";
    __function = "mjs::gc_heap::gc_move(const uint32_t)::auto_level::auto_level(uint32_t &)";
    uVar4 = 0x56;
  }
LAB_00134d91:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp",
                uVar4,__function);
}

Assistant:

auto_level(uint32_t& l) : l(l) { ++l; assert(l < 4 && "Arbitrary recursion level reached"); }